

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  ParseFlags extraout_EDX;
  ParseFlags extraout_EDX_00;
  ParseFlags PVar3;
  LogFinisher local_e9;
  char *ptr;
  LogMessage local_e0;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  
  local_e0._0_8_ = &zcis;
  zcis.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__ZeroCopyInputStream_00217dc0;
  zcis.cis_ = input;
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            (&ctx,input->recursion_budget_,input->aliasing_enabled_,&ptr,
             (ZeroCopyCodedInputStream **)&local_e0);
  ctx.group_depth_ = 0;
  ctx.data_.pool._0_4_ = *(undefined4 *)&input->extension_pool_;
  ctx.data_.pool._4_4_ = *(undefined4 *)((long)&input->extension_pool_ + 4);
  ctx.data_.factory._0_4_ = *(undefined4 *)&input->extension_factory_;
  ctx.data_.factory._4_4_ = *(undefined4 *)((long)&input->extension_factory_ + 4);
  iVar2 = (*this->_vptr_MessageLite[0xb])(this,ptr,&ctx);
  ptr = (char *)CONCAT44(extraout_var,iVar2);
  if (ptr == (char *)0x0) {
LAB_001a19d9:
    bVar1 = false;
  }
  else {
    internal::EpsCopyInputStream::BackUp(&ctx.super_EpsCopyInputStream,ptr);
    PVar3 = extraout_EDX;
    if (ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if (ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0) {
        internal::LogMessage::LogMessage
                  (&local_e0,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0xf0);
        other = internal::LogMessage::operator<<(&local_e0,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=(&local_e9,other);
        internal::LogMessage::~LogMessage(&local_e0);
        PVar3 = extraout_EDX_00;
      }
      if ((ctx.super_EpsCopyInputStream.limit_end_ < ptr) &&
         ((ctx.super_EpsCopyInputStream.next_chunk_ == (char *)0x0 ||
          ((long)ctx.super_EpsCopyInputStream.limit_ <
           (long)ptr - (long)ctx.super_EpsCopyInputStream.buffer_end_)))) goto LAB_001a19d9;
      input->last_tag_ = ctx.super_EpsCopyInputStream.last_tag_minus_1_ + 1;
    }
    bVar1 = anon_unknown_18::CheckFieldPresence
                      ((ParseContext *)this,(MessageLite *)(ulong)parse_flags,PVar3);
  }
  return bVar1;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}